

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.cpp
# Opt level: O1

char * bech32_strerror(bech32_error error_code)

{
  long lVar1;
  
  lVar1 = 8;
  if (error_code < E_BECH32_MAX_ERROR) {
    lVar1 = (ulong)error_code << 3;
  }
  return *(char **)((long)bech32_errordesc + lVar1);
}

Assistant:

const char * bech32_strerror(bech32_error error_code) {
    const char * result = "";
    if(error_code >= E_BECH32_SUCCESS && error_code < E_BECH32_MAX_ERROR) {
        result = bech32_errordesc[error_code];
    }
    else
        result = bech32_errordesc[E_BECH32_UNKNOWN_ERROR];
    return result;
}